

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O2

boolean no_bones_level(d_level *lev)

{
  char cVar1;
  boolean bVar2;
  xchar xVar3;
  s_level *psVar4;
  branch *pbVar5;
  bool bVar6;
  
  psVar4 = Is_special(lev);
  if ((psVar4 == (s_level *)0x0) || (psVar4->boneid != '\0')) {
    bVar6 = true;
    if (dungeons[lev->dnum].boneid != '\0') {
      bVar2 = Is_botlevel(lev);
      if (bVar2 == '\0') {
        pbVar5 = Is_branchlev(lev);
        if ((pbVar5 == (branch *)0x0) || (lev->dlevel < '\x02')) {
          bVar2 = In_hell(lev);
          if (bVar2 == '\0') {
            bVar6 = false;
          }
          else {
            cVar1 = lev->dlevel;
            xVar3 = dunlevs_in_dungeon(lev);
            bVar6 = xVar3 + -1 == (int)cVar1;
          }
        }
      }
    }
  }
  else {
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

static boolean no_bones_level(d_level *lev)
{
	s_level *sptr;

	return (boolean)(((sptr = Is_special(lev)) != 0 && !sptr->boneid)
		|| !dungeons[lev->dnum].boneid
		   /* no bones on the last or multiway branch levels */
		   /* in any dungeon (level 1 isn't multiway).       */
		|| Is_botlevel(lev) || (Is_branchlev(lev) && lev->dlevel > 1)
		   /* no bones in the invocation level               */
		|| (In_hell(lev) && lev->dlevel == dunlevs_in_dungeon(lev) - 1)
		);
}